

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# selu_x86_avx.cpp
# Opt level: O1

int __thiscall
ncnn::SELU_x86_avx::forward_inplace(SELU_x86_avx *this,Mat *bottom_top_blob,Option *opt)

{
  float fVar1;
  float fVar2;
  int iVar3;
  undefined1 auVar4 [32];
  int iVar5;
  uint uVar6;
  uint uVar7;
  long lVar8;
  uint uVar9;
  undefined1 (*pauVar10) [32];
  long lVar11;
  undefined1 auVar12 [16];
  float fVar13;
  float fVar14;
  float fVar15;
  float fVar16;
  float fVar17;
  float fVar18;
  float fVar19;
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [32];
  undefined1 auVar24 [32];
  undefined1 auVar25 [32];
  undefined1 auVar26 [32];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [64];
  undefined1 auVar32 [64];
  undefined1 auVar33 [64];
  
  iVar3 = bottom_top_blob->c;
  if (0 < (long)iVar3) {
    uVar9 = bottom_top_blob->h * bottom_top_blob->w * bottom_top_blob->d * bottom_top_blob->elempack
    ;
    lVar11 = 0;
    auVar32 = ZEXT3264(CONCAT428(0x3f800000,
                                 CONCAT424(0x3f800000,
                                           CONCAT420(0x3f800000,
                                                     CONCAT416(0x3f800000,
                                                               CONCAT412(0x3f800000,
                                                                         CONCAT48(0x3f800000,
                                                                                  0x3f8000003f800000
                                                                                 )))))));
    auVar31 = ZEXT1664(CONCAT412(0x3f800000,CONCAT48(0x3f800000,0x3f8000003f800000)));
    auVar33 = ZEXT1664(ZEXT816(0) << 0x40);
    do {
      pauVar10 = (undefined1 (*) [32])
                 (bottom_top_blob->cstep * lVar11 * bottom_top_blob->elemsize +
                 (long)bottom_top_blob->data);
      auVar30 = auVar31._0_16_;
      if ((int)uVar9 < 8) {
        uVar7 = 0;
      }
      else {
        fVar1 = (this->super_SELU).alpha;
        fVar2 = (this->super_SELU).lambda;
        iVar5 = 7;
        do {
          auVar25 = vminps_avx(ZEXT1632(ZEXT816(0) << 0x40),*pauVar10);
          auVar23._8_4_ = 0x42b0c0a5;
          auVar23._0_8_ = 0x42b0c0a542b0c0a5;
          auVar23._12_4_ = 0x42b0c0a5;
          auVar23._16_4_ = 0x42b0c0a5;
          auVar23._20_4_ = 0x42b0c0a5;
          auVar23._24_4_ = 0x42b0c0a5;
          auVar23._28_4_ = 0x42b0c0a5;
          auVar25 = vminps_avx(auVar25,auVar23);
          auVar24._8_4_ = 0xc2b0c0a5;
          auVar24._0_8_ = 0xc2b0c0a5c2b0c0a5;
          auVar24._12_4_ = 0xc2b0c0a5;
          auVar24._16_4_ = 0xc2b0c0a5;
          auVar24._20_4_ = 0xc2b0c0a5;
          auVar24._24_4_ = 0xc2b0c0a5;
          auVar24._28_4_ = 0xc2b0c0a5;
          auVar23 = vmaxps_avx(auVar25,auVar24);
          auVar25._0_4_ = auVar23._0_4_ * 1.442695 + 0.5;
          auVar25._4_4_ = auVar23._4_4_ * 1.442695 + 0.5;
          auVar25._8_4_ = auVar23._8_4_ * 1.442695 + 0.5;
          auVar25._12_4_ = auVar23._12_4_ * 1.442695 + 0.5;
          auVar25._16_4_ = auVar23._16_4_ * 1.442695 + 0.5;
          auVar25._20_4_ = auVar23._20_4_ * 1.442695 + 0.5;
          auVar25._24_4_ = auVar23._24_4_ * 1.442695 + 0.5;
          auVar25._28_4_ = 0x3ff8aa3b;
          auVar4 = vroundps_avx(auVar25,1);
          auVar25 = vcmpps_avx(auVar25,auVar4,1);
          auVar25 = vandps_avx(auVar32._0_32_,auVar25);
          auVar25 = vsubps_avx(auVar4,auVar25);
          fVar13 = auVar23._0_4_ + auVar25._0_4_ * -0.6931472;
          fVar14 = auVar23._4_4_ + auVar25._4_4_ * -0.6931472;
          fVar15 = auVar23._8_4_ + auVar25._8_4_ * -0.6931472;
          fVar16 = auVar23._12_4_ + auVar25._12_4_ * -0.6931472;
          fVar17 = auVar23._16_4_ + auVar25._16_4_ * -0.6931472;
          fVar18 = auVar23._20_4_ + auVar25._20_4_ * -0.6931472;
          fVar19 = auVar23._24_4_ + auVar25._24_4_ * -0.6931472;
          auVar20._0_4_ = (int)auVar25._0_4_;
          auVar20._4_4_ = (int)auVar25._4_4_;
          auVar20._8_4_ = (int)auVar25._8_4_;
          auVar20._12_4_ = (int)auVar25._12_4_;
          auVar26._16_4_ = (int)auVar25._16_4_;
          auVar26._0_16_ = auVar20;
          auVar26._20_4_ = (int)auVar25._20_4_;
          auVar26._24_4_ = (int)auVar25._24_4_;
          auVar26._28_4_ = (int)auVar25._28_4_;
          auVar27 = vpslld_avx(auVar20,0x17);
          auVar20 = vpslld_avx(auVar26._16_16_,0x17);
          auVar20 = vpaddd_avx(auVar30,auVar20);
          auVar27 = vpaddd_avx(auVar30,auVar27);
          auVar25 = vmaxps_avx(ZEXT1632(ZEXT816(0) << 0x40),*pauVar10);
          auVar4._4_4_ = (((auVar32._4_4_ + fVar14 +
                           fVar14 * fVar14 *
                           (((((fVar14 * 0.00019875691 + 0.0013981999) * fVar14 + 0.008333452) *
                              fVar14 + 0.041665796) * fVar14 + 0.16666666) * fVar14 + 0.5)) *
                           auVar27._4_4_ + -1.0) * fVar1 + auVar25._4_4_) * fVar2;
          auVar4._0_4_ = (((auVar32._0_4_ + fVar13 +
                           fVar13 * fVar13 *
                           (((((fVar13 * 0.00019875691 + 0.0013981999) * fVar13 + 0.008333452) *
                              fVar13 + 0.041665796) * fVar13 + 0.16666666) * fVar13 + 0.5)) *
                           auVar27._0_4_ + -1.0) * fVar1 + auVar25._0_4_) * fVar2;
          auVar4._8_4_ = (((auVar32._8_4_ + fVar15 +
                           fVar15 * fVar15 *
                           (((((fVar15 * 0.00019875691 + 0.0013981999) * fVar15 + 0.008333452) *
                              fVar15 + 0.041665796) * fVar15 + 0.16666666) * fVar15 + 0.5)) *
                           auVar27._8_4_ + -1.0) * fVar1 + auVar25._8_4_) * fVar2;
          auVar4._12_4_ =
               (((auVar32._12_4_ + fVar16 +
                 fVar16 * fVar16 *
                 (((((fVar16 * 0.00019875691 + 0.0013981999) * fVar16 + 0.008333452) * fVar16 +
                   0.041665796) * fVar16 + 0.16666666) * fVar16 + 0.5)) * auVar27._12_4_ + -1.0) *
                fVar1 + auVar25._12_4_) * fVar2;
          auVar4._16_4_ =
               (((auVar32._16_4_ + fVar17 +
                 fVar17 * fVar17 *
                 (((((fVar17 * 0.00019875691 + 0.0013981999) * fVar17 + 0.008333452) * fVar17 +
                   0.041665796) * fVar17 + 0.16666666) * fVar17 + 0.5)) * auVar20._0_4_ + -1.0) *
                fVar1 + auVar25._16_4_) * fVar2;
          auVar4._20_4_ =
               (((auVar32._20_4_ + fVar18 +
                 fVar18 * fVar18 *
                 (((((fVar18 * 0.00019875691 + 0.0013981999) * fVar18 + 0.008333452) * fVar18 +
                   0.041665796) * fVar18 + 0.16666666) * fVar18 + 0.5)) * auVar20._4_4_ + -1.0) *
                fVar1 + auVar25._20_4_) * fVar2;
          auVar4._24_4_ =
               (((auVar32._24_4_ + fVar19 +
                 fVar19 * fVar19 *
                 (((((fVar19 * 0.00019875691 + 0.0013981999) * fVar19 + 0.008333452) * fVar19 +
                   0.041665796) * fVar19 + 0.16666666) * fVar19 + 0.5)) * auVar20._8_4_ + -1.0) *
                fVar1 + auVar25._24_4_) * fVar2;
          auVar4._28_4_ =
               auVar32._28_4_ + auVar23._28_4_ + -0.6931472 + -0.6931472 + -1.0 + auVar25._28_4_;
          *pauVar10 = auVar4;
          pauVar10 = pauVar10 + 1;
          iVar5 = iVar5 + 8;
        } while (iVar5 < (int)uVar9);
        auVar33 = ZEXT464(0) << 0x40;
        uVar7 = uVar9 & 0xfffffff8;
      }
      auVar27._8_4_ = 0x42b0c0a5;
      auVar27._0_8_ = 0x42b0c0a542b0c0a5;
      auVar27._12_4_ = 0x42b0c0a5;
      auVar28._8_4_ = 0xc2b0c0a5;
      auVar28._0_8_ = 0xc2b0c0a5c2b0c0a5;
      auVar28._12_4_ = 0xc2b0c0a5;
      if ((int)(uVar7 | 3) < (int)uVar9) {
        fVar1 = (this->super_SELU).alpha;
        fVar2 = (this->super_SELU).lambda;
        uVar6 = uVar7;
        do {
          auVar20 = vminps_avx(auVar33._0_16_,*(undefined1 (*) [16])*pauVar10);
          auVar20 = vminps_avx(auVar20,auVar27);
          auVar12 = vmaxps_avx(auVar20,auVar28);
          auVar21._0_4_ = auVar12._0_4_ * 1.442695 + 0.5;
          auVar21._4_4_ = auVar12._4_4_ * 1.442695 + 0.5;
          auVar21._8_4_ = auVar12._8_4_ * 1.442695 + 0.5;
          auVar21._12_4_ = auVar12._12_4_ * 1.442695 + 0.5;
          auVar29._0_4_ = (int)auVar21._0_4_;
          auVar29._4_4_ = (int)auVar21._4_4_;
          auVar29._8_4_ = (int)auVar21._8_4_;
          auVar29._12_4_ = (int)auVar21._12_4_;
          auVar22 = vcvtdq2ps_avx(auVar29);
          auVar20 = vcmpps_avx(auVar21,auVar22,1);
          auVar20 = vandps_avx(auVar30,auVar20);
          auVar20 = vsubps_avx(auVar22,auVar20);
          fVar13 = auVar12._0_4_ + auVar20._0_4_ * -0.6931472;
          fVar14 = auVar12._4_4_ + auVar20._4_4_ * -0.6931472;
          fVar15 = auVar12._8_4_ + auVar20._8_4_ * -0.6931472;
          fVar16 = auVar12._12_4_ + auVar20._12_4_ * -0.6931472;
          auVar22._0_4_ = (int)auVar20._0_4_;
          auVar22._4_4_ = (int)auVar20._4_4_;
          auVar22._8_4_ = (int)auVar20._8_4_;
          auVar22._12_4_ = (int)auVar20._12_4_;
          auVar20 = vpslld_avx(auVar22,0x17);
          auVar22 = vpaddd_avx(auVar30,auVar20);
          auVar20 = vmaxps_avx(auVar33._0_16_,*(undefined1 (*) [16])*pauVar10);
          auVar12._0_4_ =
               (((auVar31._0_4_ + fVar13 +
                 fVar13 * fVar13 *
                 (((((fVar13 * 0.00019875691 + 0.0013981999) * fVar13 + 0.008333452) * fVar13 +
                   0.041665796) * fVar13 + 0.16666666) * fVar13 + 0.5)) * auVar22._0_4_ + -1.0) *
                fVar1 + auVar20._0_4_) * fVar2;
          auVar12._4_4_ =
               (((auVar31._4_4_ + fVar14 +
                 fVar14 * fVar14 *
                 (((((fVar14 * 0.00019875691 + 0.0013981999) * fVar14 + 0.008333452) * fVar14 +
                   0.041665796) * fVar14 + 0.16666666) * fVar14 + 0.5)) * auVar22._4_4_ + -1.0) *
                fVar1 + auVar20._4_4_) * fVar2;
          auVar12._8_4_ =
               (((auVar31._8_4_ + fVar15 +
                 fVar15 * fVar15 *
                 (((((fVar15 * 0.00019875691 + 0.0013981999) * fVar15 + 0.008333452) * fVar15 +
                   0.041665796) * fVar15 + 0.16666666) * fVar15 + 0.5)) * auVar22._8_4_ + -1.0) *
                fVar1 + auVar20._8_4_) * fVar2;
          auVar12._12_4_ =
               (((auVar31._12_4_ + fVar16 +
                 fVar16 * fVar16 *
                 (((((fVar16 * 0.00019875691 + 0.0013981999) * fVar16 + 0.008333452) * fVar16 +
                   0.041665796) * fVar16 + 0.16666666) * fVar16 + 0.5)) * auVar22._12_4_ + -1.0) *
                fVar1 + auVar20._12_4_) * fVar2;
          *(undefined1 (*) [16])*pauVar10 = auVar12;
          pauVar10 = (undefined1 (*) [32])(*pauVar10 + 0x10);
          uVar7 = uVar6 + 4;
          iVar5 = uVar6 + 7;
          uVar6 = uVar7;
        } while (iVar5 < (int)uVar9);
      }
      if (uVar9 - uVar7 != 0 && (int)uVar7 <= (int)uVar9) {
        fVar1 = (this->super_SELU).lambda;
        fVar2 = (this->super_SELU).alpha;
        lVar8 = 0;
        do {
          fVar13 = *(float *)(*pauVar10 + lVar8 * 4);
          if (0.0 <= fVar13) {
            fVar13 = fVar13 * (this->super_SELU).lambda;
          }
          else {
            fVar13 = expf(fVar13);
            auVar33 = ZEXT1664(ZEXT816(0) << 0x40);
            auVar31 = ZEXT1664(CONCAT412(0x3f800000,CONCAT48(0x3f800000,0x3f8000003f800000)));
            auVar32 = ZEXT3264(CONCAT428(0x3f800000,
                                         CONCAT424(0x3f800000,
                                                   CONCAT420(0x3f800000,
                                                             CONCAT416(0x3f800000,
                                                                       CONCAT412(0x3f800000,
                                                                                 CONCAT48(0x3f800000
                                                                                          ,
                                                  0x3f8000003f800000)))))));
            fVar13 = (fVar13 + -1.0) * fVar1 * fVar2;
          }
          *(float *)(*pauVar10 + lVar8 * 4) = fVar13;
          lVar8 = lVar8 + 1;
        } while (uVar9 - uVar7 != (int)lVar8);
      }
      lVar11 = lVar11 + 1;
    } while (lVar11 != iVar3);
  }
  return 0;
}

Assistant:

int SELU_x86_avx::forward_inplace(Mat& bottom_top_blob, const Option& opt) const
{
    int w = bottom_top_blob.w;
    int h = bottom_top_blob.h;
    int d = bottom_top_blob.d;
    int elempack = bottom_top_blob.elempack;
    int channels = bottom_top_blob.c;
    int size = w * h * d * elempack;

    #pragma omp parallel for num_threads(opt.num_threads)
    for (int q = 0; q < channels; q++)
    {
        float* ptr = bottom_top_blob.channel(q);

        int i = 0;

#if __SSE2__
#if __AVX__
#if __AVX512F__
        __m512 _zero512 = _mm512_setzero_ps();
        __m512 _one512 = _mm512_set1_ps(1.f);
        __m512 _alpha512 = _mm512_set1_ps(alpha);
        __m512 _lambda512 = _mm512_set1_ps(lambda);
        for (; i + 15 < size; i += 16)
        {
            __m512 _p = _mm512_loadu_ps(ptr);

            __m512 _pos = _mm512_max_ps(_zero512, _p);
            __m512 _neg = _mm512_min_ps(_zero512, _p);

            __m512 _blob = exp512_ps(_neg);
            _blob = _mm512_sub_ps(_blob, _one512);
            _blob = _mm512_mul_ps(_alpha512, _blob);
            _blob = _mm512_mul_ps(_lambda512, _mm512_add_ps(_pos, _blob));

            _mm512_storeu_ps(ptr, _blob);

            ptr += 16;
        }
#endif // __AVX512F__
        __m256 _zero256 = _mm256_setzero_ps();
        __m256 _one256 = _mm256_set1_ps(1.f);
        __m256 _alpha256 = _mm256_set1_ps(alpha);
        __m256 _lambda256 = _mm256_set1_ps(lambda);
        for (; i + 7 < size; i += 8)
        {
            __m256 _p = _mm256_loadu_ps(ptr);

            __m256 _pos = _mm256_max_ps(_zero256, _p);
            __m256 _neg = _mm256_min_ps(_zero256, _p);

            __m256 _blob = exp256_ps(_neg);
            _blob = _mm256_sub_ps(_blob, _one256);
            _blob = _mm256_mul_ps(_alpha256, _blob);
            _blob = _mm256_mul_ps(_lambda256, _mm256_add_ps(_pos, _blob));

            _mm256_storeu_ps(ptr, _blob);

            ptr += 8;
        }
#endif // __AVX__
        __m128 _zero128 = _mm_setzero_ps();
        __m128 _one128 = _mm_set1_ps(1.f);
        __m128 _alpha128 = _mm_set1_ps(alpha);
        __m128 _lambda128 = _mm_set1_ps(lambda);
        for (; i + 3 < size; i += 4)
        {
            __m128 _p = _mm_loadu_ps(ptr);

            __m128 _pos = _mm_max_ps(_zero128, _p);
            __m128 _neg = _mm_min_ps(_zero128, _p);

            __m128 _blob = exp_ps(_neg);
            _blob = _mm_sub_ps(_blob, _one128);
            _blob = _mm_mul_ps(_alpha128, _blob);
            _blob = _mm_mul_ps(_lambda128, _mm_add_ps(_pos, _blob));

            _mm_storeu_ps(ptr, _blob);

            ptr += 4;
        }
#endif // __SSE2__
        float alphaxlambda = alpha * lambda;
        for (; i < size; i++)
        {
            // y = lambda * ( max(0, x) + min(0, alpha * (exp(x) - 1)) )
            if (*ptr < 0)
                *ptr = (expf(*ptr) - 1.f) * alphaxlambda;
            else
                *ptr = *ptr * lambda;
            ptr++;
        }
    }

    return 0;
}